

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::NonMaximumSuppression::NonMaximumSuppression(NonMaximumSuppression *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NonMaximumSuppression_0072b4d0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  if (this != (NonMaximumSuppression *)&_NonMaximumSuppression_default_instance_) {
    protobuf_NonMaximumSuppression_2eproto::InitDefaults();
  }
  Specification::NonMaximumSuppression((Specification *)this);
  return;
}

Assistant:

NonMaximumSuppression::NonMaximumSuppression()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NonMaximumSuppression_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.NonMaximumSuppression)
}